

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O0

float64 set_best_quest(dtree_node_t *node,float32 ****mixw,float32 ****means,float32 ****vars,
                      uint32 *veclen,uint32 n_model,uint32 n_state,uint32 n_stream,uint32 n_density,
                      float32 *stwt,quest_t *all_q,uint32 n_all_q,pset_t *pset,uint32 **dfeat,
                      uint32 n_dfeat,float32 mwfloor)

{
  float32 ***dist_00;
  float64 fVar1;
  uint local_7c;
  uint local_78;
  uint32 k;
  uint32 j;
  uint32 s;
  float64 norm;
  float32 ***dist;
  float32 mwfloor_local;
  uint32 n_model_local;
  uint32 *veclen_local;
  float32 ****vars_local;
  float32 ****means_local;
  float32 ****mixw_local;
  dtree_node_t *node_local;
  
  dist_00 = (float32 ***)
            __ckd_calloc_3d__((ulong)n_state,(ulong)n_stream,(ulong)n_density,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                              ,0x3bb);
  for (k = 0; k < n_state; k = k + 1) {
    for (local_78 = 0; local_78 < n_stream; local_78 = local_78 + 1) {
      for (local_7c = 0; local_7c < n_density; local_7c = local_7c + 1) {
        dist_00[k][local_78][local_7c] = node->mixw_occ[k][local_78][local_7c];
      }
    }
    _j = 0.0;
    for (local_7c = 0; local_7c < n_density; local_7c = local_7c + 1) {
      _j = (double)(float)(*dist_00[k])[local_7c] + _j;
    }
    for (local_78 = 0; local_78 < n_stream; local_78 = local_78 + 1) {
      for (local_7c = 0; local_7c < n_density; local_7c = local_7c + 1) {
        dist_00[k][local_78][local_7c] =
             (float32)(float)((double)(float)dist_00[k][local_78][local_7c] * (1.0 / _j));
        if ((float)dist_00[k][local_78][local_7c] < (float)mwfloor) {
          dist_00[k][local_78][local_7c] = mwfloor;
        }
      }
    }
  }
  fVar1 = best_q(mixw,means,vars,veclen,n_model,n_state,n_stream,n_density,stwt,dfeat,n_dfeat,all_q,
                 n_all_q,pset,node->id,node->n_id,dist_00,node->wt_ent,(quest_t **)&node->q);
  node->wt_ent_dec = fVar1;
  ckd_free_3d(dist_00);
  return node->wt_ent_dec;
}

Assistant:

float64
set_best_quest(dtree_node_t *node,
	       float32 ****mixw,
               float32 ****means,
               float32 ****vars,
               uint32  *veclen,
	       uint32 n_model,
	       uint32 n_state,
	       uint32 n_stream,
	       uint32 n_density,
	       float32 *stwt,

	       quest_t *all_q,
	       uint32 n_all_q,
	       pset_t *pset,

	       uint32 **dfeat,
	       uint32 n_dfeat,

	       float32 mwfloor)
{
    float32 ***dist;
    float64 norm;
    uint32 s, j, k;
    
    dist = (float32 ***)ckd_calloc_3d(n_state, n_stream, n_density, sizeof(float32));

    /* Convert occ. counts to probabilities. norm now has total occ. count */
    for (s = 0; s < n_state; s++) {
	for (j = 0; j < n_stream; j++) {
	    for (k = 0; k < n_density; k++) {
		dist[s][j][k] = node->mixw_occ[s][j][k];
	    }
	}
	for (k = 0, norm = 0; k < n_density; k++) {
	    norm += dist[s][0][k];
	}
	norm = 1.0 / norm;
	for (j = 0; j < n_stream; j++) {
	    for (k = 0; k < n_density; k++) {
		dist[s][j][k] *= norm;
		if (dist[s][j][k] < mwfloor) {
		    dist[s][j][k] = mwfloor;
		}
	    }
	}
    }

    node->wt_ent_dec = best_q(mixw, means, vars, veclen,
                              n_model, n_state, n_stream, n_density,
			      stwt,
			      dfeat, n_dfeat,
			      all_q, n_all_q,
			      pset,
			      node->id, node->n_id,
			      dist, node->wt_ent,
			      (quest_t **)&node->q);

    ckd_free_3d((void ***)dist);

    return node->wt_ent_dec;
}